

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> *
HuffmanArchiver::get_full_code
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
          vector<bool,_std::allocator<bool>_> *code,int length)

{
  ulong *puVar1;
  ulong uVar2;
  undefined8 in_RAX;
  ulong *puVar3;
  uint uVar4;
  ulong uVar5;
  ulong *puVar6;
  size_type __n;
  uint uVar7;
  reference rVar8;
  undefined1 auStack_38 [3];
  bool local_35;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  _auStack_38 = CONCAT13(1,SUB83(in_RAX,0));
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(long)length,&local_35,(allocator_type *)(auStack_38 + 2));
  std::__reverse<std::_Bit_iterator>
            ((code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p,0,
             (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p,
             (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset);
  puVar6 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  puVar1 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  __n = 0;
  uVar5 = 0;
  local_34 = (code->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset;
  while ((uVar7 = (uint)uVar5, puVar6 != puVar1 || (uVar7 != local_34))) {
    uVar2 = *puVar6;
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](__return_storage_ptr__,__n);
    puVar3 = rVar8._M_p;
    if ((uVar2 >> (uVar5 & 0x3f) & 1) == 0) {
      uVar5 = ~rVar8._M_mask & *puVar3;
    }
    else {
      uVar5 = rVar8._M_mask | *puVar3;
    }
    *puVar3 = uVar5;
    __n = __n + 1;
    uVar4 = uVar7 + 1;
    puVar6 = puVar6 + (uVar7 == 0x3f);
    if (uVar7 == 0x3f) {
      uVar4 = 0;
    }
    uVar5 = (ulong)uVar4;
  }
  rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](__return_storage_ptr__,__n);
  *rVar8._M_p = *rVar8._M_p & ~rVar8._M_mask;
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> HuffmanArchiver::get_full_code(std::vector<bool> code, int length) {
    std::vector<bool> res(length, true);
    std::size_t i = 0;
    std::reverse(code.begin(), code.end());
    for (bool bit : code) {
        res[i] = bit;
        i++;
    }
    res[i] = false;
    return res;
}